

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O0

void __thiscall
toml::detail::location::location
          (location *this,string *source_name,vector<char,_std::allocator<char>_> *cont)

{
  element_type *this_00;
  const_iterator cVar1;
  undefined1 local_30 [24];
  vector<char,_std::allocator<char>_> *cont_local;
  string *source_name_local;
  location *this_local;
  
  local_30._16_8_ = cont;
  cont_local = (vector<char,_std::allocator<char>_> *)source_name;
  source_name_local = (string *)this;
  region_base::region_base(&this->super_region_base);
  (this->super_region_base)._vptr_region_base = (_func_int **)&PTR__location_00366418;
  std::make_shared<std::vector<char,std::allocator<char>>,std::vector<char,std::allocator<char>>>
            ((vector<char,_std::allocator<char>_> *)local_30);
  std::shared_ptr<std::vector<char,std::allocator<char>>const>::
  shared_ptr<std::vector<char,std::allocator<char>>,void>
            ((shared_ptr<std::vector<char,std::allocator<char>>const> *)&this->source_,
             (shared_ptr<std::vector<char,_std::allocator<char>_>_> *)local_30);
  std::shared_ptr<std::vector<char,_std::allocator<char>_>_>::~shared_ptr
            ((shared_ptr<std::vector<char,_std::allocator<char>_>_> *)local_30);
  this->line_number_ = 1;
  std::__cxx11::string::string((string *)&this->source_name_,(string *)source_name);
  this_00 = std::
            __shared_ptr_access<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->source_);
  cVar1 = std::vector<char,_std::allocator<char>_>::cbegin(this_00);
  (this->iter_)._M_current = cVar1._M_current;
  return;
}

Assistant:

location(std::string source_name, std::vector<char> cont)
      : source_(std::make_shared<std::vector<char>>(std::move(cont))),
        line_number_(1), source_name_(std::move(source_name)), iter_(source_->cbegin())
    {}